

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

void __thiscall llvm::APInt::AssignSlowCase(APInt *this,APInt *RHS)

{
  if (this != RHS) {
    reallocate(this,RHS->BitWidth);
    if (0x40 < (ulong)this->BitWidth) {
      memcpy((this->U).pVal,(RHS->U).pVal,
             (ulong)((uint)((ulong)this->BitWidth + 0x3f >> 3) & 0xfffffff8));
      return;
    }
    this->U = RHS->U;
  }
  return;
}

Assistant:

void APInt::AssignSlowCase(const APInt& RHS) {
  // Don't do anything for X = X
  if (this == &RHS)
    return;

  // Adjust the bit width and handle allocations as necessary.
  reallocate(RHS.getBitWidth());

  // Copy the data.
  if (isSingleWord())
    U.VAL = RHS.U.VAL;
  else
    memcpy(U.pVal, RHS.U.pVal, getNumWords() * APINT_WORD_SIZE);
}